

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::parser<pstore::exchange::import_ns::callbacks>::set_error
          (parser<pstore::exchange::import_ns::callbacks> *this,error_code err)

{
  int iVar1;
  
  iVar1 = err._M_value;
  if (iVar1 != 0 || (this->error_)._M_value == 0) {
    (this->error_)._M_value = iVar1;
    (this->error_)._M_cat = err._M_cat;
    return iVar1 != 0;
  }
  assert_failed("!error_ || err",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0xe3);
}

Assistant:

bool set_error (std::error_code const err) noexcept {
                PSTORE_ASSERT (!error_ || err);
                error_ = err;
                return this->has_error ();
            }